

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::makeSetVar(wasm::Expression*,wasm::Expression*,wasm::Name,wasm::NameScope_
          (void *this,Expression *curr,Expression *value,Name name,NameScope scope)

{
  size_t sVar1;
  Value *this_00;
  Ref RVar2;
  Ref RVar3;
  void *__ptr;
  Ref right;
  IString nextResult;
  IString op;
  Name name_00;
  string_view sVar4;
  
  right.inst = name.super_IString.str._M_str;
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)value;
  sVar4 = (string_view)fromName(*this,name_00,(NameScope)name.super_IString.str._M_str);
  __ptr = (void *)0x18;
  this_00 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  this_00->type = Null;
  cashew::Value::free(this_00,__ptr);
  this_00->type = String;
  (this_00->field_1).str.str = sVar4;
  sVar1 = BLOCK;
  RVar3.inst = cashew::SET.inst;
  nextResult.str._M_str = cashew::RSHIFT;
  nextResult.str._M_len = EXPRESSION_RESULT;
  RVar2 = visit(wasm::Expression*,wasm::IString_(this,curr,nextResult);
  op.str._M_str = (char *)RVar2.inst;
  op.str._M_len = sVar1;
  RVar3 = cashew::ValueBuilder::makeBinary((ValueBuilder *)this_00,RVar3,op,right);
  return (Ref)RVar3.inst;
}

Assistant:

Ref makeSetVar(Expression* curr,
                   Expression* value,
                   Name name,
                   NameScope scope) {
      return ValueBuilder::makeBinary(
        ValueBuilder::makeName(fromName(name, scope)),
        SET,
        visit(value, EXPRESSION_RESULT));
    }